

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t faster_despace(char *bytes,size_t howmany)

{
  byte bVar1;
  size_t sStack_28;
  char c;
  size_t pos;
  size_t i;
  size_t howmany_local;
  char *bytes_local;
  
  pos = 0;
  sStack_28 = 0;
  while (pos < howmany) {
    bVar1 = bytes[pos];
    bytes[sStack_28] = bVar1;
    sStack_28 = (long)jump_table[bVar1] + sStack_28;
    pos = pos + 1;
  }
  return sStack_28;
}

Assistant:

size_t faster_despace(char *bytes, size_t howmany) {
  size_t i = 0, pos = 0;
  while (i < howmany) {
    const char c = bytes[i++];
    bytes[pos] = c;
    pos += jump_table[(unsigned char)c];
  }
  return pos;
}